

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest::~TextSerializerTest(TextSerializerTest *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TextSerializerTest_001a3368;
  ClientMetric::~ClientMetric(&this->metric);
  std::__cxx11::string::~string((string *)&this->name);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

std::string Serialize(MetricType type) const {
    MetricFamily metricFamily;
    metricFamily.name = name;
    metricFamily.help = "my metric help text";
    metricFamily.type = type;
    metricFamily.metric = std::vector<ClientMetric>{metric};

    std::vector<MetricFamily> families{metricFamily};

    return textSerializer.Serialize(families);
  }